

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

VisitReturn __thiscall
QMakeEvaluator::evaluateFunction
          (QMakeEvaluator *this,ProFunctionDef *func,QList<ProStringList> *argumentsList,
          ProStringList *ret)

{
  size_type sVar1;
  qsizetype qVar2;
  ProFile *this_00;
  QList<ProStringList> *in_RDX;
  ProFunctionDef *in_RSI;
  QMap<ProKey,_ProStringList> *in_RDI;
  long in_FS_OFFSET;
  Location LVar3;
  QByteArrayView QVar4;
  int i;
  VisitReturn vr;
  ProStringList args;
  ProFile *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  ProKey *in_stack_fffffffffffffe88;
  QByteArrayView *in_stack_fffffffffffffe90;
  const_reference in_stack_fffffffffffffe98;
  ProKey *key;
  int local_148;
  VisitReturn local_144;
  undefined1 local_108 [96];
  undefined1 local_a8 [72];
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined1 local_48 [8];
  storage_type *local_40;
  undefined1 local_30 [24];
  ProFile *local_18;
  ushort local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  sVar1 = std::__cxx11::
          list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>::size
                    ((list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                      *)0x2fdace);
  if (sVar1 < 100) {
    key = (ProKey *)(in_RDI + 0x40);
    memset(local_48,0,8);
    QMap<ProKey,_ProStringList>::QMap((QMap<ProKey,_ProStringList> *)0x2fdb62);
    ProValueMapStack::push
              ((ProValueMapStack *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (ProValueMap *)in_stack_fffffffffffffe78);
    QMap<ProKey,_ProStringList>::~QMap((QMap<ProKey,_ProStringList> *)0x2fdb81);
    QStack<QMakeEvaluator::Location>::push
              ((QStack<QMakeEvaluator::Location> *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (Location *)in_stack_fffffffffffffe78);
    local_60 = 0xaaaaaaaaaaaaaaaa;
    local_58 = 0xaaaaaaaaaaaaaaaa;
    local_50 = 0xaaaaaaaaaaaaaaaa;
    ProStringList::ProStringList((ProStringList *)0x2fdbd0);
    local_148 = 0;
    while( true ) {
      qVar2 = QList<ProStringList>::size(in_RDX);
      if (qVar2 <= local_148) break;
      QList<ProStringList>::operator[]
                ((QList<ProStringList> *)
                 CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 (qsizetype)in_stack_fffffffffffffe78);
      QList<ProString>::operator+=
                ((QList<ProString> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 (QList<ProString> *)in_stack_fffffffffffffe78);
      in_stack_fffffffffffffe98 =
           QList<ProStringList>::operator[]
                     ((QList<ProStringList> *)
                      CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                      (qsizetype)in_stack_fffffffffffffe78);
      ProValueMapStack::top((ProValueMapStack *)0x2fdc41);
      QString::number((int)local_a8,local_148 + 1);
      ProKey::ProKey(in_stack_fffffffffffffe88,
                     (QString *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      QMap<ProKey,_ProStringList>::operator[](in_RDI,key);
      ProStringList::operator=
                ((ProStringList *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 (ProStringList *)in_stack_fffffffffffffe78);
      ProKey::~ProKey((ProKey *)0x2fdca0);
      QString::~QString((QString *)0x2fdcad);
      local_148 = local_148 + 1;
    }
    ProValueMapStack::top((ProValueMapStack *)0x2fdcce);
    QMap<ProKey,_ProStringList>::operator[](in_RDI,key);
    ProStringList::operator=
              ((ProStringList *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (ProStringList *)in_stack_fffffffffffffe78);
    qVar2 = QList<ProStringList>::size(in_RDX);
    QString::number((longlong)local_108,(int)qVar2);
    ProString::ProString
              ((ProString *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (QString *)in_stack_fffffffffffffe78);
    ProStringList::ProStringList
              ((ProStringList *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (ProString *)in_stack_fffffffffffffe78);
    ProValueMapStack::top((ProValueMapStack *)0x2fdd4b);
    QMap<ProKey,_ProStringList>::operator[](in_RDI,key);
    ProStringList::operator=
              ((ProStringList *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (ProStringList *)in_stack_fffffffffffffe78);
    ProStringList::~ProStringList((ProStringList *)0x2fdd7e);
    ProString::~ProString((ProString *)0x2fdd8b);
    QString::~QString((QString *)0x2fdd98);
    this_00 = ProFunctionDef::pro(in_RSI);
    ProFunctionDef::tokPtr
              ((ProFunctionDef *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    local_144 = visitProBlock((QMakeEvaluator *)
                              CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                              in_stack_fffffffffffffe78,(ushort *)0x2fddc3);
    if (local_144 == ReturnReturn) {
      local_144 = ReturnTrue;
    }
    if (local_144 == ReturnTrue) {
      ProStringList::operator=
                ((ProStringList *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 (ProStringList *)in_stack_fffffffffffffe78);
    }
    QList<ProString>::clear
              ((QList<ProString> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    LVar3 = QStack<QMakeEvaluator::Location>::pop((QStack<QMakeEvaluator::Location> *)this_00);
    local_18 = LVar3.pro;
    local_10 = LVar3.line;
    in_RDI[2].d.d.ptr =
         (QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
          *)local_18;
    *(ushort *)&in_RDI[3].d.d.ptr = local_10;
    ProValueMapStack::pop((ProValueMapStack *)in_stack_fffffffffffffe98);
    QMap<ProKey,_ProStringList>::~QMap((QMap<ProKey,_ProStringList> *)0x2fde6e);
    ProStringList::~ProStringList((ProStringList *)0x2fde7b);
  }
  else {
    QByteArrayView::QByteArrayView<43ul>
              (in_stack_fffffffffffffe90,(char (*) [43])in_stack_fffffffffffffe88);
    QVar4.m_data = local_40;
    QVar4.m_size = (qsizetype)local_30;
    QString::fromLatin1(QVar4);
    evalError((QMakeEvaluator *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
              (QString *)in_stack_fffffffffffffe78);
    QString::~QString((QString *)0x2fdb24);
    local_144 = ReturnError;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_144;
  }
  __stack_chk_fail();
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::evaluateFunction(
        const ProFunctionDef &func, const QList<ProStringList> &argumentsList, ProStringList *ret)
{
    VisitReturn vr;

    if (m_valuemapStack.size() >= 100) {
        evalError(fL1S("Ran into infinite recursion (depth > 100)."));
        vr = ReturnError;
    } else {
        m_valuemapStack.push(ProValueMap());
        m_locationStack.push(m_current);

        ProStringList args;
        for (int i = 0; i < argumentsList.size(); ++i) {
            args += argumentsList[i];
            m_valuemapStack.top()[ProKey(QString::number(i+1))] = argumentsList[i];
        }
        m_valuemapStack.top()[statics.strARGS] = args;
        m_valuemapStack.top()[statics.strARGC] = ProStringList(ProString(QString::number(argumentsList.size())));
        vr = visitProBlock(func.pro(), func.tokPtr());
        if (vr == ReturnReturn)
            vr = ReturnTrue;
        if (vr == ReturnTrue)
            *ret = m_returnValue;
        m_returnValue.clear();

        m_current = m_locationStack.pop();
        m_valuemapStack.pop();
    }
    return vr;
}